

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O3

bool deqp::egl::compareCorners(Surface *oldSurface,Surface *newSurface)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int width;
  int height;
  int y;
  bool bVar5;
  int y_00;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int x;
  int x_00;
  void *pvVar9;
  ConstPixelBufferAccess newAccess;
  ConstPixelBufferAccess oldAccess;
  ConstPixelBufferAccess local_a8;
  ConstPixelBufferAccess local_80;
  ConstPixelBufferAccess local_58;
  
  iVar1 = oldSurface->m_width;
  iVar2 = oldSurface->m_height;
  iVar3 = newSurface->m_width;
  iVar4 = newSurface->m_height;
  width = iVar3;
  if (iVar1 < iVar3) {
    width = iVar1;
  }
  height = iVar4;
  if (iVar2 < iVar4) {
    height = iVar2;
  }
  bVar6 = true;
  do {
    x_00 = iVar3 - width;
    x = iVar1 - width;
    if (bVar6) {
      x = 0;
      x_00 = 0;
    }
    bVar7 = true;
    do {
      bVar5 = bVar7;
      y = iVar4 - height;
      y_00 = iVar2 - height;
      if (bVar5) {
        y = 0;
        y_00 = 0;
      }
      local_80.m_format.order = RGBA;
      local_80.m_format.type = UNORM_INT8;
      pvVar9 = (void *)(oldSurface->m_pixels).m_cap;
      if (pvVar9 != (void *)0x0) {
        pvVar9 = (oldSurface->m_pixels).m_ptr;
      }
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&local_a8,&local_80.m_format,oldSurface->m_width,oldSurface->m_height,1,pvVar9);
      tcu::getSubregion(&local_80,&local_a8,x,y_00,width,height);
      local_a8.m_format.order = RGBA;
      local_a8.m_format.type = UNORM_INT8;
      pvVar9 = (void *)(newSurface->m_pixels).m_cap;
      if (pvVar9 != (void *)0x0) {
        pvVar9 = (newSurface->m_pixels).m_ptr;
      }
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&local_58,&local_a8.m_format,newSurface->m_width,newSurface->m_height,1,pvVar9);
      tcu::getSubregion(&local_a8,&local_58,x_00,y,width,height);
      bVar8 = compareRectangles(&local_80,&local_a8);
      if (bVar8) {
        return bVar8;
      }
      bVar7 = false;
    } while (bVar5);
    bVar7 = !bVar6;
    bVar6 = false;
    if (bVar7) {
      return bVar8;
    }
  } while( true );
}

Assistant:

bool compareCorners (const Surface& oldSurface, const Surface& newSurface)
{
	const int	oldWidth	= oldSurface.getWidth();
	const int	oldHeight	= oldSurface.getHeight();
	const int	newWidth	= newSurface.getWidth();
	const int	newHeight	= newSurface.getHeight();
	const int	minWidth	= de::min(oldWidth, newWidth);
	const int	minHeight	= de::min(oldHeight, newHeight);

	for (int xCorner = 0; xCorner < 2; ++xCorner)
	{
		const int oldX = xCorner == 0 ? 0 : oldWidth - minWidth;
		const int newX = xCorner == 0 ? 0 : newWidth - minWidth;

		for (int yCorner = 0; yCorner < 2; ++yCorner)
		{
			const int				oldY		= yCorner == 0 ? 0 : oldHeight - minHeight;
			const int				newY		= yCorner == 0 ? 0 : newHeight - minHeight;
			ConstPixelBufferAccess	oldAccess	=
				getSubregion(oldSurface.getAccess(), oldX, oldY, minWidth, minHeight);
			ConstPixelBufferAccess	newAccess	=
				getSubregion(newSurface.getAccess(), newX, newY, minWidth, minHeight);

			if (compareRectangles(oldAccess, newAccess))
				return true;
		}
	}

	return false;
}